

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

bool __thiscall
Rml::FontEffectGlow::Initialise
          (FontEffectGlow *this,int _width_outline,int _width_blur,Vector2i _offset)

{
  ConvolutionFilter *this_00;
  ConvolutionFilter *this_01;
  bool bVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  Vector2i _kernel_radii;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (-1 < (_width_blur | _width_outline)) {
    this->width_outline = _width_outline;
    this->width_blur = _width_blur;
    this->combined_width = _width_blur + _width_outline;
    this->offset = _offset;
    ConvolutionFilter::Initialise(&this->filter_outline,_width_outline,Dilation);
    uVar7 = this->width_outline;
    if (-1 < (int)uVar7) {
      iVar5 = -uVar7;
      do {
        if (SBORROW4(this->width_outline,-uVar7) == (int)(this->width_outline + uVar7) < 0) {
          uVar8 = ~uVar7;
          lVar4 = (long)(int)-uVar7;
          do {
            fVar9 = Math::SquareRoot((float)((int)lVar4 * (int)lVar4 + iVar5 * iVar5));
            iVar6 = this->width_outline;
            fVar11 = 1.0;
            if (((float)iVar6 < fVar9) && (fVar11 = (float)(iVar6 + 1) - fVar9, fVar11 <= 0.0)) {
              fVar11 = 0.0;
            }
            pfVar2 = ConvolutionFilter::operator[](&this->filter_outline,iVar6 + iVar5);
            iVar6 = this->width_outline;
            pfVar2[iVar6 + lVar4] = fVar11;
            uVar8 = uVar8 + 1;
            lVar4 = lVar4 + 1;
          } while ((int)uVar8 < iVar6);
        }
        uVar7 = this->width_outline;
        bVar1 = iVar5 < (int)uVar7;
        iVar5 = iVar5 + 1;
      } while (bVar1);
    }
    fVar9 = 1.0;
    if (this->width_blur != 0) {
      fVar9 = (float)this->width_blur * 0.4;
    }
    fVar9 = (fVar9 + fVar9) * fVar9;
    fVar11 = Math::SquareRoot(fVar9 * 3.1415927);
    this_00 = &this->filter_blur_x;
    _kernel_radii.y = 0;
    _kernel_radii.x = this->width_blur;
    ConvolutionFilter::Initialise(this_00,_kernel_radii,Sum);
    this_01 = &this->filter_blur_y;
    ConvolutionFilter::Initialise(this_01,(Vector2i)((ulong)(uint)this->width_blur << 0x20),Sum);
    iVar5 = this->width_blur;
    if (iVar5 < 0) {
      fVar12 = 0.0;
    }
    else {
      lVar4 = (long)-iVar5;
      fVar12 = 0.0;
      do {
        iVar6 = (int)lVar4;
        fVar10 = Math::SquareRoot((float)(iVar6 * iVar6) / fVar9);
        fVar10 = Math::Exp(-fVar10);
        fVar10 = fVar10 * (1.0 / fVar11);
        pfVar2 = ConvolutionFilter::operator[](this_00,0);
        iVar5 = this->width_blur;
        pfVar2[iVar5 + lVar4] = fVar10;
        pfVar2 = ConvolutionFilter::operator[](this_01,iVar5 + iVar6);
        *pfVar2 = fVar10;
        fVar12 = fVar12 + fVar10;
        lVar4 = lVar4 + 1;
        iVar5 = this->width_blur;
      } while (iVar6 < iVar5);
    }
    if (SBORROW4(this->width_blur,-iVar5) == this->width_blur + iVar5 < 0) {
      lVar4 = (long)-iVar5;
      do {
        pfVar2 = ConvolutionFilter::operator[](this_00,0);
        iVar5 = this->width_blur;
        iVar6 = (int)lVar4;
        lVar3 = iVar5 + lVar4;
        pfVar2[lVar3] = pfVar2[lVar3] / fVar12;
        pfVar2 = ConvolutionFilter::operator[](this_01,iVar5 + iVar6);
        *pfVar2 = *pfVar2 / fVar12;
        lVar4 = lVar4 + 1;
      } while (iVar6 < this->width_blur);
    }
  }
  return -1 < (_width_blur | _width_outline);
}

Assistant:

bool FontEffectGlow::Initialise(int _width_outline, int _width_blur, Vector2i _offset)
{
	if (_width_outline < 0 || _width_blur < 0)
		return false;

	width_outline = _width_outline;
	width_blur = _width_blur;
	combined_width = width_blur + width_outline;
	offset = _offset;

	// Outline filter.
	filter_outline.Initialise(width_outline, FilterOperation::Dilation);
	for (int x = -width_outline; x <= width_outline; ++x)
	{
		for (int y = -width_outline; y <= width_outline; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width_outline)
			{
				weight = (width_outline + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter_outline[x + width_outline][y + width_outline] = weight;
		}
	}

	// Gaussian blur filter
	const float std_dev = (width_blur == 0 ? 1.f : .4f * float(width_blur));
	const float two_variance = 2.f * std_dev * std_dev;
	const float gain = 1.f / Math::SquareRoot(Math::RMLUI_PI * two_variance);

	float sum_weight = 0.f;

	// We separate the blur filter into two passes, horizontal and vertical, for performance reasons.
	filter_blur_x.Initialise(Vector2i(width_blur, 0), FilterOperation::Sum);
	filter_blur_y.Initialise(Vector2i(0, width_blur), FilterOperation::Sum);

	for (int x = -width_blur; x <= width_blur; ++x)
	{
		float weight = gain * Math::Exp(-Math::SquareRoot(float(x * x) / two_variance));

		filter_blur_x[0][x + width_blur] = weight;
		filter_blur_y[x + width_blur][0] = weight;
		sum_weight += weight;
	}

	// Normalize the kernels
	for (int x = -width_blur; x <= width_blur; ++x)
	{
		filter_blur_x[0][x + width_blur] /= sum_weight;
		filter_blur_y[x + width_blur][0] /= sum_weight;
	}

	return true;
}